

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_decompressBlock_deprecated
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  void *pvVar1;
  size_t err_code;
  size_t sVar2;
  
  dctx->isFrameDecompression = 0;
  pvVar1 = dctx->previousDstEnd;
  if (dstCapacity != 0 && pvVar1 != dst) {
    dctx->dictEnd = pvVar1;
    dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar1) + (long)dst);
    dctx->prefixStart = dst;
    dctx->previousDstEnd = dst;
  }
  sVar2 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,not_streaming);
  if (sVar2 < 0xffffffffffffff89) {
    dctx->previousDstEnd = (void *)((long)dst + sVar2);
  }
  return sVar2;
}

Assistant:

size_t ZSTD_decompressBlock_deprecated(ZSTD_DCtx* dctx,
                                       void* dst, size_t dstCapacity,
                                 const void* src, size_t srcSize)
{
    size_t dSize;
    dctx->isFrameDecompression = 0;
    ZSTD_checkContinuity(dctx, dst, dstCapacity);
    dSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, not_streaming);
    FORWARD_IF_ERROR(dSize, "");
    dctx->previousDstEnd = (char*)dst + dSize;
    return dSize;
}